

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

TrackedSection * __thiscall
Catch::SectionTracking::TrackedSection::acquireChild(TrackedSection *this,string *childName)

{
  TrackedSection *pTVar1;
  TrackedSection TStack_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
  local_98;
  
  pTVar1 = findChild(this,childName);
  if (pTVar1 == (TrackedSection *)0x0) {
    TrackedSection(&TStack_f8,childName,this);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
    ::pair<Catch::SectionTracking::TrackedSection,_true>(&local_98,childName,&TStack_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::SectionTracking::TrackedSection>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
                *)&this->m_children,&local_98);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
    ::~pair(&local_98);
    ~TrackedSection(&TStack_f8);
    pTVar1 = findChild(this,childName);
  }
  return pTVar1;
}

Assistant:

TrackedSection* acquireChild( std::string const& childName ) {
            if( TrackedSection* child = findChild( childName ) )
                return child;
            m_children.insert( std::make_pair( childName, TrackedSection( childName, this ) ) );
            return findChild( childName );
        }